

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbString.cpp
# Opt level: O0

CbString * __thiscall
Hpipe::CbString::read_line
          (CbString *__return_storage_ptr__,CbString *this,char sep,bool skip_void_lines)

{
  bool bVar1;
  byte *pbVar2;
  bool bVar3;
  anon_class_16_2_441e4f48 local_38;
  PT local_28;
  PT pcr;
  bool skip_void_lines_local;
  CbString *pCStack_18;
  char sep_local;
  CbString *this_local;
  CbString *res;
  
  pcr._6_1_ = skip_void_lines;
  pcr._7_1_ = sep;
  pCStack_18 = this;
  this_local = __return_storage_ptr__;
  if (skip_void_lines) {
    while( true ) {
      bVar1 = empty(this);
      bVar3 = false;
      if (!bVar1) {
        pbVar2 = ptr(this);
        bVar3 = (uint)*pbVar2 == (int)pcr._7_1_;
      }
      if (!bVar3) break;
      skip_byte(this);
    }
  }
  local_28 = 0;
  local_38.pcr = &local_28;
  local_38.sep = pcr._7_1_;
  visitor<Hpipe::CbString::read_line(char,bool)::__0>(this,&local_38);
  CbString(__return_storage_ptr__,this,0,local_28);
  skip_some(this,local_28 + 1);
  return __return_storage_ptr__;
}

Assistant:

CbString CbString::read_line( char sep, bool skip_void_lines ) {
    if ( skip_void_lines )
        while ( not empty() and *ptr() == sep )
            skip_byte();
    // find sep
    PT pcr = 0;
    visitor( [ &pcr, sep ]( const Buffer *b, unsigned off, unsigned used ) {
        for( unsigned val = off; val < used; ++val ) {
            if ( b->data[ val ] == sep ) {
                pcr += val - off;
                return false;
            }
        }
        pcr += used - off;
        return true;
    } );
    CbString res{ *this, 0, pcr };
    skip_some( pcr + 1 );
    return res;
}